

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
__thiscall
SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
operator<<(SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
           *this,SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                 bits)

{
  if (bits.m_int < 0) {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x1776,
                  "SafeInt<T, E> SafeInt<signed char>::operator<<(SafeInt<U, E>) const [T = signed char, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = long]"
                 );
  }
  if ((ulong)bits.m_int < 8) {
    return (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            )((char)*this << ((byte)bits.m_int & 0x1f));
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x1777,
                "SafeInt<T, E> SafeInt<signed char>::operator<<(SafeInt<U, E>) const [T = signed char, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = long]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator <<( SafeInt< U, E > bits ) const SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        return SafeInt< T, E >( (T)( m_int << (U)bits ) );
    }